

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int socket_get(nng_socket s,char *name,void *val,size_t *szp,nni_type t)

{
  int iVar1;
  nni_sock *local_30;
  nni_sock *sock;
  
  iVar1 = nni_sock_find(&local_30,s.id);
  if (iVar1 == 0) {
    iVar1 = nni_sock_getopt(local_30,name,val,(size_t *)0x0,(nni_type)szp);
    nni_sock_rele(local_30);
  }
  return iVar1;
}

Assistant:

static int
socket_get(nng_socket s, const char *name, void *val, size_t *szp, nni_type t)
{
	nni_sock *sock;
	int       rv;

	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	rv = nni_sock_getopt(sock, name, val, szp, t);
	nni_sock_rele(sock);
	return (rv);
}